

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  uint uVar1;
  int iVar2;
  xmlXPathContextPtr pxVar3;
  xmlNode *node;
  xmlNsPtr *ppxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar3 = ctxt->context;
  if ((pxVar3 != (xmlXPathContextPtr)0x0) && (node = pxVar3->node, node->type == XML_ELEMENT_NODE))
  {
    if (cur == (xmlNodePtr)0x0) {
      if (pxVar3->tmpNsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(pxVar3->tmpNsList);
        pxVar3 = ctxt->context;
        node = pxVar3->node;
      }
      pxVar3->tmpNsNr = 0;
      iVar2 = xmlGetNsListSafe(pxVar3->doc,node,&pxVar3->tmpNsList);
      if (-1 < iVar2) {
        pxVar3 = ctxt->context;
        ppxVar4 = pxVar3->tmpNsList;
        if (ppxVar4 == (xmlNsPtr *)0x0) {
          return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
        }
        iVar2 = pxVar3->tmpNsNr;
        if (ppxVar4[iVar2] == (xmlNsPtr)0x0) {
          return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
        }
        ppxVar4 = ppxVar4 + iVar2;
        do {
          ppxVar4 = ppxVar4 + 1;
          iVar2 = iVar2 + 1;
        } while (*ppxVar4 != (xmlNsPtr)0x0);
        pxVar3->tmpNsNr = iVar2;
        return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
      }
      xmlXPathPErrMemory(ctxt);
    }
    else {
      ppxVar4 = pxVar3->tmpNsList;
      if (0 < pxVar3->tmpNsNr) {
        uVar1 = pxVar3->tmpNsNr - 1;
        pxVar3->tmpNsNr = uVar1;
        return (xmlNodePtr)ppxVar4[uVar1];
      }
      if (ppxVar4 != (xmlNsPtr *)0x0) {
        (*xmlFree)(ppxVar4);
        pxVar3 = ctxt->context;
      }
      pxVar3->tmpNsList = (xmlNsPtr *)0x0;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE) return(NULL);
    if (cur == NULL) {
        if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsNr = 0;
        if (xmlGetNsListSafe(ctxt->context->doc, ctxt->context->node,
                             &ctxt->context->tmpNsList) < 0) {
            xmlXPathPErrMemory(ctxt);
            return(NULL);
        }
        if (ctxt->context->tmpNsList != NULL) {
            while (ctxt->context->tmpNsList[ctxt->context->tmpNsNr] != NULL) {
                ctxt->context->tmpNsNr++;
            }
        }
	return((xmlNodePtr) xmlXPathXMLNamespace);
    }
    if (ctxt->context->tmpNsNr > 0) {
	return (xmlNodePtr)ctxt->context->tmpNsList[--ctxt->context->tmpNsNr];
    } else {
	if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsList = NULL;
	return(NULL);
    }
}